

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_std::nullopt_t_&,_const_std::optional<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>_&>
::streamReconstructedExpression
          (BinaryExpr<const_std::nullopt_t_&,_const_std::optional<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  StringRef::operator_cast_to_string(&local_40,(StringRef *)Detail::unprintableString);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringRef::operator_cast_to_string(&local_60,(StringRef *)Detail::unprintableString);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }